

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionSet.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
OpenMD::SelectionSet::countBits
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,SelectionSet *this)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  
  piVar2 = (int *)operator_new(0x18);
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = piVar2;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = piVar2 + 6;
  piVar2[0] = 0;
  piVar2[1] = 0;
  piVar2[2] = 0;
  piVar2[3] = 0;
  piVar2[4] = 0;
  piVar2[5] = 0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = piVar2 + 6;
  lVar3 = 0;
  do {
    iVar1 = OpenMDBitSet::countBits
                      ((OpenMDBitSet *)
                       ((long)&(((this->bitsets_).
                                 super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                               super__Bvector_base<std::allocator<bool>_> + lVar3));
    *piVar2 = iVar1;
    lVar3 = lVar3 + 0x28;
    piVar2 = piVar2 + 1;
  } while (lVar3 != 0xf0);
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> SelectionSet::countBits() {
    std::vector<int> result(N_SELECTIONTYPES, 0);
    for (int i = 0; i < N_SELECTIONTYPES; i++)
      result[i] = bitsets_[i].countBits();
    return result;
  }